

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymProp::gen_code(CTcSymProp *this,int discard)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int in_ESI;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    sVar3 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2836b5);
    uVar2 = (uint)sVar3;
    pcVar4 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2836c3);
    CTcTokenizer::log_error(0x2cf5,(ulong)uVar2,pcVar4);
  }
  else {
    iVar1 = CTcGenTarg::is_speculative(G_cg);
    if (iVar1 == 0) {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write_prop_id
                ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcDataStream::write_prop_id
                ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      CTcGenTarg::note_push((CTcGenTarg *)0x28373e);
      CTcGenTarg::note_pop((CTcGenTarg *)0x28374d);
    }
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
      CTcGenTarg::note_push((CTcGenTarg *)0x2837a5);
    }
  }
  return;
}

Assistant:

void CTcSymProp::gen_code(int discard)
{
    /* 
     *   Evaluating a property is equivalent to calling the property on
     *   the "self" object with no arguments.  If there's no "self"
     *   object, an unqualified property evaluation is not possible, so
     *   log an error if this is the case.  
     */
    if (!G_cs->is_self_available())
    {
        G_tok->log_error(TCERR_PROP_NEEDS_OBJ, (int)get_sym_len(), get_sym());
        return;
    }

    if (G_cg->is_speculative())
    {
        /* push 'self', then evaluate the property in data-only mode */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_GETPROPDATA);
        G_cs->write_prop_id(prop_);

        /* we pushed the 'self' value then popped it again */
        G_cg->note_push();
        G_cg->note_pop();
    }
    else
    {
        /* generate the call to 'self' */
        G_cg->write_op(OPC_GETPROPSELF);
        G_cs->write_prop_id(prop_);
    }

    /* if they're not discarding the value, push the result */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}